

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.h
# Opt level: O0

void __thiscall wallet::CCrypter::CleanKey(CCrypter *this)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data(in_stack_ffffffffffffffc8);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::size(in_stack_ffffffffffffffc8);
  memory_cleanse(in_stack_ffffffffffffffc8,0x1eb776);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data(in_stack_ffffffffffffffc8);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::size(in_stack_ffffffffffffffc8);
  memory_cleanse(in_stack_ffffffffffffffc8,0x1eb7a5);
  *(undefined1 *)(in_RDI + 0x30) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CleanKey()
    {
        memory_cleanse(vchKey.data(), vchKey.size());
        memory_cleanse(vchIV.data(), vchIV.size());
        fKeySet = false;
    }